

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O3

Iterator __thiscall HashSet<String>::insert(HashSet<String> *this,Iterator *position,String *key)

{
  Item **ppIVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  ulong uVar6;
  Item *pIVar7;
  Iterator this_00;
  void *buffer;
  undefined8 *puVar8;
  Item *pIVar9;
  char *pcVar10;
  HashSet<String> *pHVar11;
  
  this_00 = find(this,key);
  if (this_00.item == *(Item **)this) {
    if (*(long *)(this + 0x20) == 0) {
      lVar5 = *(long *)(this + 0x18);
      buffer = operator_new__(lVar5 << 3);
      *(void **)(this + 0x20) = buffer;
      Memory::zero(buffer,lVar5 << 3);
    }
    this_00.item = *(Item **)(this + 0x70);
    if (this_00.item == (Item *)0x0) {
      puVar8 = (undefined8 *)operator_new__(0x128);
      *puVar8 = *(undefined8 *)(this + 0x78);
      *(undefined8 **)(this + 0x78) = puVar8;
      puVar8[0x11] = 0;
      puVar8[0x1a] = puVar8 + 10;
      pIVar9 = (Item *)(puVar8 + 0x1c);
      puVar8[0x23] = puVar8 + 0x13;
      this_00.item = (Item *)(puVar8 + 1);
    }
    else {
      pIVar9 = (this_00.item)->prev;
    }
    *(Item **)(this + 0x70) = pIVar9;
    uVar6 = key->data->len;
    pcVar10 = String::operator_cast_to_char_(key);
    cVar2 = *pcVar10;
    cVar3 = pcVar10[uVar6 >> 1];
    cVar4 = pcVar10[(ulong)(uVar6 == 0) + (uVar6 - 1)];
    String::String(&(this_00.item)->key,key);
    ppIVar1 = (Item **)(*(long *)(this + 0x20) +
                       (((long)cVar4 ^
                        ((long)cVar3 ^ ((long)cVar2 ^ uVar6 * 0x41a7) * 0x41a7) * 0x41a7) %
                       *(ulong *)(this + 0x18)) * 8);
    (this_00.item)->cell = ppIVar1;
    pIVar9 = *ppIVar1;
    (this_00.item)->nextCell = pIVar9;
    if (pIVar9 != (Item *)0x0) {
      pIVar9->cell = &(this_00.item)->nextCell;
    }
    *ppIVar1 = this_00.item;
    pIVar9 = position->item;
    pIVar7 = pIVar9->prev;
    (this_00.item)->prev = pIVar7;
    pHVar11 = (HashSet<String> *)&pIVar7->next;
    if (pIVar7 == (Item *)0x0) {
      pHVar11 = this + 8;
    }
    *(Item **)pHVar11 = this_00.item;
    (this_00.item)->next = pIVar9;
    pIVar9->prev = this_00.item;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  return (Iterator)this_00.item;
}

Assistant:

Iterator insert(const Iterator& position, const T& key)
  {
    Iterator it = find(key);
    if (it != _end) return it;

    if (!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*)* capacity);
    }

    Item* item;
    if (freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for (Item* i = item + 1, *end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item)Item(key) == item);
#else
    new(item)Item(key);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;

    Item* insertPos = position.item;
    if ((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }